

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O2

void __thiscall
slang::analysis::ClockInference::ExpansionInstance::ExpansionInstance
          (ExpansionInstance *this,AssertionInstanceExpression *expr,TimingControl *clock)

{
  bool bVar1;
  pointer ptVar2;
  long lVar3;
  
  this->expr = expr;
  this->clock = clock;
  this->hasInferredClockArg = false;
  ptVar2 = (expr->arguments)._M_ptr;
  lVar3 = (expr->arguments)._M_extent._M_extent_value * 0x18;
  while( true ) {
    if (lVar3 == 0) {
      return;
    }
    if (((ptVar2 != (pointer)0x0) &&
        (*(__index_type *)
          ((long)&(ptVar2->
                  super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                  ).
                  super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                  .
                  super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                  ._M_head_impl.
                  super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                  .
                  super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
          + 8) == '\0')) &&
       (bVar1 = isInferredClockCall(*(Expression **)
                                     &(ptVar2->
                                      super__Tuple_impl<0UL,_const_slang::ast::Symbol_*,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                                      ).
                                      super__Tuple_impl<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_>
                                      .
                                      super__Head_base<1UL,_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>,_false>
                                      ._M_head_impl.
                                      super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                                      .
                                      super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                                   ), bVar1)) break;
    ptVar2 = ptVar2 + 1;
    lVar3 = lVar3 + -0x18;
  }
  this->hasInferredClockArg = true;
  return;
}

Assistant:

ClockInference::ExpansionInstance::ExpansionInstance(const AssertionInstanceExpression& expr,
                                                     const TimingControl* clock) :
    expr(&expr), clock(clock) {

    // Determine if this instance has an inferred clocking default argument.
    for (auto& arg : expr.arguments) {
        if (auto argExpr = std::get_if<const Expression*>(&std::get<1>(arg))) {
            if (ClockInference::isInferredClockCall(**argExpr)) {
                hasInferredClockArg = true;
                break;
            }
        }
    }
}